

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O0

void fe_hamming_window(frame_t *in,window_t *window,int32 in_len,int32 remove_dc)

{
  double local_30;
  frame_t mean;
  int i;
  int32 remove_dc_local;
  int32 in_len_local;
  window_t *window_local;
  frame_t *in_local;
  
  if (remove_dc != 0) {
    local_30 = 0.0;
    for (mean._4_4_ = 0; mean._4_4_ < in_len; mean._4_4_ = mean._4_4_ + 1) {
      local_30 = (double)in[mean._4_4_] + local_30;
    }
    for (mean._4_4_ = 0; mean._4_4_ < in_len; mean._4_4_ = mean._4_4_ + 1) {
      in[mean._4_4_] = (frame_t)((double)in[mean._4_4_] - local_30 / (double)in_len);
    }
  }
  for (mean._4_4_ = 0; mean._4_4_ < in_len / 2; mean._4_4_ = mean._4_4_ + 1) {
    in[mean._4_4_] = (frame_t)((double)in[mean._4_4_] * (double)window[mean._4_4_]);
    in[(in_len + -1) - mean._4_4_] =
         (frame_t)((double)in[(in_len + -1) - mean._4_4_] * (double)window[mean._4_4_]);
  }
  return;
}

Assistant:

static void
fe_hamming_window(frame_t * in, window_t * window, int32 in_len,
                  int32 remove_dc)
{
    int i;

    if (remove_dc) {
        frame_t mean = 0;

        for (i = 0; i < in_len; i++)
            mean += in[i];
        mean /= in_len;
        for (i = 0; i < in_len; i++)
            in[i] -= (frame_t) mean;
    }

    for (i = 0; i < in_len / 2; i++) {
        in[i] = COSMUL(in[i], window[i]);
        in[in_len - 1 - i] = COSMUL(in[in_len - 1 - i], window[i]);
    }
}